

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O0

void __thiscall NPC::Act(NPC *this)

{
  double dVar1;
  byte bVar2;
  World *pWVar3;
  Character *this_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ENF_Data *pEVar8;
  vector<NPC_*,_std::allocator<NPC_*>_> *this_01;
  reference ppNVar9;
  mapped_type *pmVar10;
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *this_02;
  pointer pNVar11;
  byte *pbVar12;
  list<Character_*,_std::allocator<Character_*>_> *this_03;
  reference ppCVar13;
  int iVar14;
  double dVar15;
  double dVar16;
  int local_178;
  int act;
  int absydiff;
  int absxdiff;
  int ydiff;
  int xdiff;
  int distance_2;
  Character *character;
  iterator __end2_2;
  iterator __begin2_2;
  list<Character_*,_std::allocator<Character_*>_> *__range2_2;
  key_type local_138;
  byte local_111;
  Character *pCStack_110;
  uchar closest_distance;
  Character *closest;
  int distance_1;
  unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *local_e0;
  unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *opponent_1;
  iterator __end3;
  iterator __begin3;
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *__range3;
  int distance;
  unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *local_98;
  unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *opponent;
  iterator __end2_1;
  iterator __begin2_1;
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *__range2_1;
  unsigned_short attacker_damage;
  allocator<char> local_61;
  key_type local_60;
  byte local_39;
  Character *pCStack_38;
  uchar attacker_distance;
  Character *attacker;
  NPC *npc;
  iterator __end2;
  iterator __begin2;
  vector<NPC_*,_std::allocator<NPC_*>_> *__range2;
  NPC *this_local;
  
  pEVar8 = ENF(this);
  if ((pEVar8->child != 0) && (this->parent == (NPC *)0x0)) {
    this_01 = &this->map->npcs;
    __end2 = std::vector<NPC_*,_std::allocator<NPC_*>_>::begin(this_01);
    npc = (NPC *)std::vector<NPC_*,_std::allocator<NPC_*>_>::end(this_01);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                                       *)&npc), bVar4) {
      ppNVar9 = __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
                operator*(&__end2);
      attacker = (Character *)*ppNVar9;
      pEVar8 = ENF((NPC *)attacker);
      if (pEVar8->boss != 0) {
        this->parent = (NPC *)attacker;
        break;
      }
      __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::operator++
                (&__end2);
    }
  }
  iVar5 = util::rand();
  this->last_act = (double)iVar5 / 1000.0 + this->last_act;
  if (this->spawn_type != '\a') {
    pCStack_38 = (Character *)0x0;
    pWVar3 = this->map->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"NPCChaseDistance",&local_61);
    pmVar10 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
              ::operator[](&(pWVar3->config).
                            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                           ,&local_60);
    iVar5 = util::variant::operator_cast_to_int(pmVar10);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    __range2_1._2_2_ = 0;
    local_39 = (byte)iVar5;
    pEVar8 = ENF(this);
    if ((pEVar8->type == Passive) || (pEVar8 = ENF(this), pEVar8->type == Aggressive)) {
      __end2_1 = std::__cxx11::
                 list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                 ::begin(&this->damagelist);
      opponent = (unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *)
                 std::__cxx11::
                 list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                 ::end(&this->damagelist);
      while (bVar4 = std::operator!=(&__end2_1,(_Self *)&opponent), bVar4) {
        local_98 = std::
                   _List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>
                   ::operator*(&__end2_1);
        pNVar11 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                            (local_98);
        __range3._6_1_ = 0;
        __range3._5_1_ = 0;
        bVar4 = true;
        if (pNVar11->attacker->map == this->map) {
          pNVar11 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                              (local_98);
          bVar4 = true;
          if ((pNVar11->attacker->nowhere & 1U) == 0) {
            pNVar11 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                                (local_98);
            dVar1 = pNVar11->last_hit;
            dVar15 = Timer::GetTime();
            pWVar3 = this->map->world;
            std::allocator<char>::allocator();
            __range3._6_1_ = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&distance,"NPCBoredTimer",(allocator<char> *)((long)&__range3 + 7))
            ;
            __range3._5_1_ = 1;
            pmVar10 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                      ::operator[](&(pWVar3->config).
                                    super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                   ,(key_type *)&distance);
            dVar16 = util::variant::operator_cast_to_double(pmVar10);
            bVar4 = dVar1 < dVar15 - dVar16;
          }
        }
        if ((__range3._5_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&distance);
        }
        if ((__range3._6_1_ & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
        }
        if (!bVar4) {
          pNVar11 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                              (local_98);
          bVar2 = pNVar11->attacker->x;
          pNVar11 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                              (local_98);
          __range3._0_4_ =
               util::path_length((uint)bVar2,(uint)pNVar11->attacker->y,(uint)this->x,(uint)this->y)
          ;
          if ((uint)__range3 == 0) {
            __range3._0_4_ = 1;
          }
          if (((int)(uint)__range3 < (int)(uint)local_39) ||
             (((uint)__range3 == local_39 &&
              (pNVar11 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::
                         operator->(local_98), (int)(uint)__range2_1._2_2_ < pNVar11->damage)))) {
            pNVar11 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                                (local_98);
            pCStack_38 = pNVar11->attacker;
            pNVar11 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                                (local_98);
            __range2_1._2_2_ = (ushort)pNVar11->damage;
            local_39 = (byte)(uint)__range3;
          }
        }
        std::_List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>::
        operator++(&__end2_1);
      }
      if (this->parent != (NPC *)0x0) {
        this_02 = &this->parent->damagelist;
        __end3 = std::__cxx11::
                 list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                 ::begin(this_02);
        opponent_1 = (unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *)
                     std::__cxx11::
                     list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                     ::end(this_02);
        while (bVar4 = std::operator!=(&__end3,(_Self *)&opponent_1), bVar4) {
          local_e0 = std::
                     _List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>
                     ::operator*(&__end3);
          pNVar11 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                              (local_e0);
          closest._6_1_ = 0;
          closest._5_1_ = 0;
          bVar4 = true;
          if (pNVar11->attacker->map == this->map) {
            pNVar11 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                                (local_e0);
            bVar4 = true;
            if ((pNVar11->attacker->nowhere & 1U) == 0) {
              pNVar11 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::
                        operator->(local_e0);
              dVar1 = pNVar11->last_hit;
              dVar15 = Timer::GetTime();
              pWVar3 = this->map->world;
              std::allocator<char>::allocator();
              closest._6_1_ = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&distance_1,"NPCBoredTimer",
                         (allocator<char> *)((long)&closest + 7));
              closest._5_1_ = 1;
              pmVar10 = std::
                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ::operator[](&(pWVar3->config).
                                      super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                     ,(key_type *)&distance_1);
              dVar16 = util::variant::operator_cast_to_double(pmVar10);
              bVar4 = dVar1 < dVar15 - dVar16;
            }
          }
          if ((closest._5_1_ & 1) != 0) {
            std::__cxx11::string::~string((string *)&distance_1);
          }
          if ((closest._6_1_ & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)((long)&closest + 7));
          }
          if (!bVar4) {
            pNVar11 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                                (local_e0);
            bVar2 = pNVar11->attacker->x;
            pNVar11 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                                (local_e0);
            closest._0_4_ =
                 util::path_length((uint)bVar2,(uint)pNVar11->attacker->y,(uint)this->x,
                                   (uint)this->y);
            if ((uint)closest == 0) {
              closest._0_4_ = 1;
            }
            if (((int)(uint)closest < (int)(uint)local_39) ||
               (((uint)closest == local_39 &&
                (pNVar11 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::
                           operator->(local_e0), (int)(uint)__range2_1._2_2_ < pNVar11->damage)))) {
              pNVar11 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::
                        operator->(local_e0);
              pCStack_38 = pNVar11->attacker;
              pNVar11 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::
                        operator->(local_e0);
              __range2_1._2_2_ = (ushort)pNVar11->damage;
              local_39 = (byte)(uint)closest;
            }
          }
          std::_List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>::
          operator++(&__end3);
        }
      }
    }
    pEVar8 = ENF(this);
    if ((pEVar8->type == Aggressive) ||
       ((this->parent != (NPC *)0x0 && (pCStack_38 != (Character *)0x0)))) {
      pCStack_110 = (Character *)0x0;
      pWVar3 = this->map->world;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"NPCChaseDistance",(allocator<char> *)((long)&__range2_2 + 7))
      ;
      pmVar10 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                ::operator[](&(pWVar3->config).
                              super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             ,&local_138);
      iVar5 = util::variant::operator_cast_to_int(pmVar10);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_2 + 7));
      local_111 = (byte)iVar5;
      if (pCStack_38 != (Character *)0x0) {
        pCStack_110 = pCStack_38;
        pbVar12 = std::min<unsigned_char>(&local_111,&local_39);
        local_111 = *pbVar12;
      }
      this_03 = &this->map->characters;
      __end2_2 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(this_03);
      character = (Character *)
                  std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(this_03);
      while (bVar4 = std::operator!=(&__end2_2,(_Self *)&character), bVar4) {
        ppCVar13 = std::_List_iterator<Character_*>::operator*(&__end2_2);
        this_00 = *ppCVar13;
        bVar4 = Character::IsHideNpc(this_00);
        if ((!bVar4) && (bVar4 = Character::CanInteractCombat(this_00), bVar4)) {
          ydiff = util::path_length((uint)this_00->x,(uint)this_00->y,(uint)this->x,(uint)this->y);
          if (ydiff == 0) {
            ydiff = 1;
          }
          if (ydiff < (int)(uint)local_111) {
            local_111 = (byte)ydiff;
            pCStack_110 = this_00;
          }
        }
        std::_List_iterator<Character_*>::operator++(&__end2_2);
      }
      if (pCStack_110 != (Character *)0x0) {
        pCStack_38 = pCStack_110;
      }
    }
    if (pCStack_38 == (Character *)0x0) {
      if (this->walk_idle_for == 0) {
        local_178 = util::rand();
      }
      else {
        this->walk_idle_for = this->walk_idle_for + -1;
        local_178 = 0xb;
      }
      if ((0 < local_178) && (local_178 < 7)) {
        Walk(this,this->direction);
      }
      if ((6 < local_178) && (local_178 < 10)) {
        iVar5 = util::rand();
        Walk(this,(Direction)iVar5);
      }
      if (local_178 == 10) {
        iVar5 = util::rand();
        this->walk_idle_for = iVar5;
      }
    }
    else {
      iVar14 = (uint)this->x - (uint)pCStack_38->x;
      iVar6 = (uint)this->y - (uint)pCStack_38->y;
      iVar5 = iVar14;
      if (iVar14 < 1) {
        iVar5 = -iVar14;
      }
      iVar7 = iVar6;
      if (iVar6 < 1) {
        iVar7 = -iVar6;
      }
      if ((((iVar5 == 1) && (iVar7 == 0)) || ((iVar5 == 0 && (iVar7 == 1)))) ||
         ((iVar5 == 0 && (iVar7 == 0)))) {
        Attack(this,pCStack_38);
      }
      else {
        if (iVar7 < iVar5) {
          if (iVar14 < 0) {
            this->direction = DIRECTION_RIGHT;
          }
          else {
            this->direction = DIRECTION_LEFT;
          }
        }
        else if (iVar6 < 0) {
          this->direction = DIRECTION_DOWN;
        }
        else {
          this->direction = DIRECTION_UP;
        }
        bVar4 = Walk(this,this->direction);
        if (!bVar4) {
          if ((this->direction == DIRECTION_UP) || (this->direction == DIRECTION_DOWN)) {
            if (iVar14 < 0) {
              this->direction = DIRECTION_RIGHT;
            }
            else {
              this->direction = DIRECTION_LEFT;
            }
          }
          bVar4 = Walk(this,this->direction);
          if (!bVar4) {
            iVar5 = util::rand();
            Walk(this,(Direction)iVar5);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void NPC::Act()
{
	// Needed for the server startup spawn to work properly
	if (this->ENF().child && !this->parent)
	{
		UTIL_FOREACH(this->map->npcs, npc)
		{
			if (npc->ENF().boss)
			{
				this->parent = npc;
				break;
			}
		}
	}

	this->last_act += double(util::rand(int(this->act_speed * 750.0), int(this->act_speed * 1250.0))) / 1000.0;

	if (this->spawn_type == 7)
	{
		return;
	}

	Character *attacker = 0;
	unsigned char attacker_distance = static_cast<int>(this->map->world->config["NPCChaseDistance"]);
	unsigned short attacker_damage = 0;

	if (this->ENF().type == ENF::Passive || this->ENF().type == ENF::Aggressive)
	{
		UTIL_FOREACH_CREF(this->damagelist, opponent)
		{
			if (opponent->attacker->map != this->map || opponent->attacker->nowhere || opponent->last_hit < Timer::GetTime() - static_cast<double>(this->map->world->config["NPCBoredTimer"]))
			{
				continue;
			}

			int distance = util::path_length(opponent->attacker->x, opponent->attacker->y, this->x, this->y);

			if (distance == 0)
				distance = 1;

			if ((distance < attacker_distance) || (distance == attacker_distance && opponent->damage > attacker_damage))
			{
				attacker = opponent->attacker;
				attacker_damage = opponent->damage;
				attacker_distance = distance;
			}
		}

		if (this->parent)
		{
			UTIL_FOREACH_CREF(this->parent->damagelist, opponent)
			{
				if (opponent->attacker->map != this->map || opponent->attacker->nowhere || opponent->last_hit < Timer::GetTime() - static_cast<double>(this->map->world->config["NPCBoredTimer"]))
				{
					continue;
				}

				int distance = util::path_length(opponent->attacker->x, opponent->attacker->y, this->x, this->y);

				if (distance == 0)
					distance = 1;

				if ((distance < attacker_distance) || (distance == attacker_distance && opponent->damage > attacker_damage))
				{
					attacker = opponent->attacker;
					attacker_damage = opponent->damage;
					attacker_distance = distance;
				}
			}
		}
	}

	if (this->ENF().type == ENF::Aggressive || (this->parent && attacker))
	{
		Character *closest = 0;
		unsigned char closest_distance = static_cast<int>(this->map->world->config["NPCChaseDistance"]);

		if (attacker)
		{
			closest = attacker;
			closest_distance = std::min(closest_distance, attacker_distance);
		}

		UTIL_FOREACH(this->map->characters, character)
		{
			if (character->IsHideNpc() || !character->CanInteractCombat())
				continue;

			int distance = util::path_length(character->x, character->y, this->x, this->y);

			if (distance == 0)
				distance = 1;

			if (distance < closest_distance)
			{
				closest = character;
				closest_distance = distance;
			}
		}

		if (closest)
		{
			attacker = closest;
		}
	}
	
	if (attacker)
	{
		int xdiff = this->x - attacker->x;
		int ydiff = this->y - attacker->y;
		int absxdiff = std::abs(xdiff);
		int absydiff = std::abs(ydiff);

		if ((absxdiff == 1 && absydiff == 0) || (absxdiff == 0 && absydiff == 1) || (absxdiff == 0 && absydiff == 0))
		{
			this->Attack(attacker);
			return;
		}
		else if (absxdiff > absydiff)
		{
			if (xdiff < 0)
			{
				this->direction = DIRECTION_RIGHT;
			}
			else
			{
				this->direction = DIRECTION_LEFT;
			}
		}
		else
		{
			if (ydiff < 0)
			{
				this->direction = DIRECTION_DOWN;
			}
			else
			{
				this->direction = DIRECTION_UP;
			}
		}

		if (this->Walk(this->direction) == Map::WalkFail)
		{
			if (this->direction == DIRECTION_UP || this->direction == DIRECTION_DOWN)
			{
				if (xdiff < 0)
				{
					this->direction = DIRECTION_RIGHT;
				}
				else
				{
					this->direction = DIRECTION_LEFT;
				}
			}

			if (this->Walk(static_cast<Direction>(this->direction)) == Map::WalkFail)
			{
				this->Walk(static_cast<Direction>(util::rand(0,3)));
			}
		}
	}
	else
	{
		// Random walking

		int act;
		if (this->walk_idle_for == 0)
		{
			act = util::rand(1,10);
		}
		else
		{
			--this->walk_idle_for;
			act = 11;
		}

		if (act >= 1 && act <= 6) // 60% chance walk foward
		{
			this->Walk(this->direction);
		}

		if (act >= 7 && act <= 9) // 30% change direction
		{
			this->Walk(static_cast<Direction>(util::rand(0,3)));
		}

		if (act == 10) // 10% take a break
		{
			this->walk_idle_for = util::rand(1,4);
		}
	}
}